

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# frame_enc.c
# Opt level: O3

int VP8EncTokenLoop(VP8Encoder *enc)

{
  VP8EncProba *proba;
  VP8TBuffer *b;
  int iVar1;
  VP8RDLevel rd_opt;
  int iVar2;
  bool bVar3;
  VP8Encoder *enc_00;
  bool bVar4;
  int iVar5;
  int iVar6;
  int iVar7;
  int iVar8;
  VP8Encoder *enc_1;
  ulong uVar9;
  size_t sVar10;
  ulong uVar11;
  int iVar12;
  int iVar13;
  int16_t (*paiVar14) [16];
  int16_t (*paiVar15) [16];
  long lVar16;
  uint ok;
  ulong uVar17;
  ulong uVar18;
  bool bVar19;
  long lVar20;
  ulong uVar21;
  long lVar22;
  long lVar23;
  bool bVar24;
  bool bVar25;
  double dVar26;
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  VP8Residual res;
  VP8ModeScore info;
  VP8EncIterator it;
  long local_1398;
  PassStats local_1310;
  VP8Residual local_12d8;
  VP8ModeScore local_12a8;
  VP8EncIterator local_f38;
  
  iVar8 = enc->mb_w_;
  iVar6 = enc->mb_h_;
  iVar12 = ((VP8Encoder *)enc->config_)->num_parts_;
  iVar1 = enc->do_search_;
  rd_opt = enc->rd_opt_level_;
  InitPassStats((VP8Encoder *)enc->config_,&local_1310);
  iVar5 = PreLoopInitialize(enc);
  if (iVar5 == 0) {
    iVar8 = 0;
  }
  else {
    proba = &enc->proba_;
    lVar23 = (long)iVar6 * (long)iVar8;
    iVar5 = (int)lVar23;
    iVar6 = iVar5 >> 3;
    iVar8 = 0x60;
    if (0x60 < iVar6) {
      iVar8 = iVar6;
    }
    if (0 < iVar12) {
      lVar23 = lVar23 * 0x180;
      b = &enc->tokens_;
      auVar27._8_4_ = (int)((ulong)lVar23 >> 0x20);
      auVar27._0_8_ = lVar23;
      auVar27._12_4_ = 0x45300000;
      do {
        iVar6 = iVar12 + -1;
        bVar24 = true;
        if ((0.4 < ABS(local_1310.dq)) && (iVar6 != 0)) {
          bVar24 = enc->max_i4_header_bits_ == 0;
        }
        VP8IteratorInit(enc,&local_f38);
        SetLoopParams(enc,local_1310.q);
        if (bVar24) {
          memset((enc->proba_).stats_,0,0x1080);
          VP8InitFilter(&local_f38);
        }
        VP8TBufferClear(b);
        lVar16 = 0;
        local_1398 = 0;
        iVar7 = iVar8;
        do {
          VP8IteratorImport(&local_f38,(uint8_t *)0x0);
          if (iVar7 < 1) {
            FinalizeTokenProbas(proba);
            VP8CalculateLevelCosts(proba);
            iVar7 = iVar8;
          }
          else {
            iVar7 = iVar7 + -1;
          }
          VP8Decimate(&local_f38,&local_12a8,rd_opt);
          enc_00 = local_f38.enc_;
          VP8IteratorNzToBytes(&local_f38);
          bVar25 = ((uint)*local_f38.mb_ & 3) != 1;
          if (bVar25) {
            iVar13 = 3;
          }
          else {
            iVar13 = local_f38.left_nz_[8] + local_f38.top_nz_[8];
            VP8InitResidual(0,1,enc_00,&local_12d8);
            (*VP8SetResidualCoeffs)(local_12a8.y_dc_levels,&local_12d8);
            local_f38.top_nz_[8] = VP8RecordCoeffTokens(iVar13,&local_12d8,b);
            iVar13 = 0;
            local_f38.left_nz_[8] = local_f38.top_nz_[8];
          }
          VP8InitResidual((uint)!bVar25,iVar13,enc_00,&local_12d8);
          paiVar14 = local_12a8.y_ac_levels;
          lVar22 = 0;
          do {
            lVar20 = 0x21;
            paiVar15 = paiVar14;
            do {
              iVar13 = local_f38.left_nz_[lVar22];
              iVar2 = *(int *)(local_f38.i4_boundary_ + lVar20 * 4 + -0x50);
              (*VP8SetResidualCoeffs)(*paiVar15,&local_12d8);
              iVar13 = VP8RecordCoeffTokens(iVar13 + iVar2,&local_12d8,b);
              local_f38.left_nz_[lVar22] = iVar13;
              *(int *)(local_f38.i4_boundary_ + lVar20 * 4 + -0x50) = iVar13;
              lVar20 = lVar20 + 1;
              paiVar15 = paiVar15 + 1;
            } while (lVar20 != 0x25);
            lVar22 = lVar22 + 1;
            paiVar14 = paiVar14 + 4;
          } while (lVar22 != 4);
          VP8InitResidual(0,2,enc_00,&local_12d8);
          uVar11 = 0;
          bVar25 = true;
          do {
            bVar3 = bVar25;
            uVar17 = 0;
            bVar25 = true;
            do {
              bVar4 = bVar25;
              uVar9 = uVar17 | uVar11 | 4;
              iVar13 = local_f38.left_nz_[uVar9];
              uVar18 = 0;
              bVar25 = true;
              do {
                bVar19 = bVar25;
                uVar21 = uVar18 | uVar11 | 4;
                iVar2 = local_f38.top_nz_[uVar21];
                (*VP8SetResidualCoeffs)
                          (local_12a8.uv_levels[uVar18 | (uVar17 | uVar11) * 2],&local_12d8);
                iVar13 = VP8RecordCoeffTokens(iVar13 + iVar2,&local_12d8,b);
                local_f38.left_nz_[uVar9] = iVar13;
                local_f38.top_nz_[uVar21] = iVar13;
                uVar18 = 1;
                bVar25 = false;
              } while (bVar19);
              uVar17 = 1;
              bVar25 = false;
            } while (bVar4);
            uVar11 = 2;
          } while (bVar3);
          VP8IteratorBytesToNz(&local_f38);
          if ((enc->tokens_).error_ != 0) {
            WebPEncodingSetError(enc->pic_,VP8_ENC_ERROR_OUT_OF_MEMORY);
            goto LAB_00134dd3;
          }
          lVar16 = lVar16 + local_12a8.H;
          local_1398 = local_1398 + local_12a8.D;
          if (bVar24) {
            StoreSideInfo(&local_f38);
            VP8StoreFilterStats(&local_f38);
            VP8IteratorExport(&local_f38);
            iVar13 = VP8IteratorProgress(&local_f38,0x14);
            VP8IteratorSaveBoundary(&local_f38);
            if (iVar13 == 0) goto LAB_00134dd3;
          }
          else {
            VP8IteratorSaveBoundary(&local_f38);
          }
          iVar13 = VP8IteratorNext(&local_f38);
        } while (iVar13 != 0);
        uVar11 = lVar16 + (enc->segment_hdr_).size_;
        if (local_1310.do_size_search == 0) {
          dVar26 = 99.0;
          if (local_1398 != 0 && iVar5 != 0) {
            auVar28._8_4_ = (int)((ulong)local_1398 >> 0x20);
            auVar28._0_8_ = local_1398;
            auVar28._12_4_ = 0x45300000;
            dVar26 = log10((((auVar27._8_8_ - 1.9342813113834067e+25) +
                            ((double)CONCAT44(0x43300000,(int)lVar23) - 4503599627370496.0)) *
                           65025.0) /
                           ((auVar28._8_8_ - 1.9342813113834067e+25) +
                           ((double)CONCAT44(0x43300000,(int)local_1398) - 4503599627370496.0)));
            dVar26 = dVar26 * 10.0;
          }
        }
        else {
          iVar7 = FinalizeTokenProbas(proba);
          sVar10 = VP8EstimateTokenSize(b,(uint8_t *)(enc->proba_).coeffs_);
          dVar26 = (double)((sVar10 + (long)iVar7 + uVar11 + 0x400 >> 0xb) + 0x1e);
        }
        local_1310.value = dVar26;
        if ((enc->max_i4_header_bits_ < 1) || (uVar11 < 0x3fc00001)) {
          if (bVar24) break;
          iVar12 = iVar6;
          if (iVar1 != 0) {
            ComputeNextQ(&local_1310);
          }
        }
        else {
          enc->max_i4_header_bits_ = (uint)enc->max_i4_header_bits_ >> 1;
          if (bVar24) {
            if ((local_f38.enc_)->pic_->stats != (WebPAuxStats *)0x0) {
              (local_f38.enc_)->block_count_[2] = 0;
              (local_f38.enc_)->block_count_[0] = 0;
              (local_f38.enc_)->block_count_[1] = 0;
            }
            (local_f38.enc_)->sse_count_ = 0;
            (local_f38.enc_)->sse_[0] = 0;
            (local_f38.enc_)->sse_[1] = 0;
            (local_f38.enc_)->sse_[2] = 0;
          }
        }
      } while (0 < iVar12);
    }
    if (local_1310.do_size_search == 0) {
      FinalizeTokenProbas(proba);
    }
    iVar8 = VP8EmitTokens(&enc->tokens_,enc->parts_,(uint8_t *)(enc->proba_).coeffs_,1);
    if (iVar8 == 0) {
LAB_00134dd3:
      ok = 0;
    }
    else {
      iVar8 = WebPReportProgress(enc->pic_,enc->percent_ + 0x14,&enc->percent_);
      ok = (uint)(iVar8 != 0);
    }
    iVar8 = PostLoopFinalize(&local_f38,ok);
  }
  return iVar8;
}

Assistant:

int VP8EncTokenLoop(VP8Encoder* const enc) {
  // Roughly refresh the proba eight times per pass
  int max_count = (enc->mb_w_ * enc->mb_h_) >> 3;
  int num_pass_left = enc->config_->pass;
  const int do_search = enc->do_search_;
  VP8EncIterator it;
  VP8EncProba* const proba = &enc->proba_;
  const VP8RDLevel rd_opt = enc->rd_opt_level_;
  const uint64_t pixel_count = enc->mb_w_ * enc->mb_h_ * 384;
  PassStats stats;
  int ok;

  InitPassStats(enc, &stats);
  ok = PreLoopInitialize(enc);
  if (!ok) return 0;

  if (max_count < MIN_COUNT) max_count = MIN_COUNT;

  assert(enc->num_parts_ == 1);
  assert(enc->use_tokens_);
  assert(proba->use_skip_proba_ == 0);
  assert(rd_opt >= RD_OPT_BASIC);   // otherwise, token-buffer won't be useful
  assert(num_pass_left > 0);

  while (ok && num_pass_left-- > 0) {
    const int is_last_pass = (fabs(stats.dq) <= DQ_LIMIT) ||
                             (num_pass_left == 0) ||
                             (enc->max_i4_header_bits_ == 0);
    uint64_t size_p0 = 0;
    uint64_t distortion = 0;
    int cnt = max_count;
    VP8IteratorInit(enc, &it);
    SetLoopParams(enc, stats.q);
    if (is_last_pass) {
      ResetTokenStats(enc);
      VP8InitFilter(&it);  // don't collect stats until last pass (too costly)
    }
    VP8TBufferClear(&enc->tokens_);
    do {
      VP8ModeScore info;
      VP8IteratorImport(&it, NULL);
      if (--cnt < 0) {
        FinalizeTokenProbas(proba);
        VP8CalculateLevelCosts(proba);  // refresh cost tables for rd-opt
        cnt = max_count;
      }
      VP8Decimate(&it, &info, rd_opt);
      ok = RecordTokens(&it, &info, &enc->tokens_);
      if (!ok) {
        WebPEncodingSetError(enc->pic_, VP8_ENC_ERROR_OUT_OF_MEMORY);
        break;
      }
      size_p0 += info.H;
      distortion += info.D;
      if (is_last_pass) {
        StoreSideInfo(&it);
        VP8StoreFilterStats(&it);
        VP8IteratorExport(&it);
        ok = VP8IteratorProgress(&it, 20);
      }
      VP8IteratorSaveBoundary(&it);
    } while (ok && VP8IteratorNext(&it));
    if (!ok) break;

    size_p0 += enc->segment_hdr_.size_;
    if (stats.do_size_search) {
      uint64_t size = FinalizeTokenProbas(&enc->proba_);
      size += VP8EstimateTokenSize(&enc->tokens_,
                                   (const uint8_t*)proba->coeffs_);
      size = (size + size_p0 + 1024) >> 11;  // -> size in bytes
      size += HEADER_SIZE_ESTIMATE;
      stats.value = (double)size;
    } else {  // compute and store PSNR
      stats.value = GetPSNR(distortion, pixel_count);
    }

#if (DEBUG_SEARCH > 0)
    printf("#%2d metric:%.1lf -> %.1lf   last_q=%.2lf q=%.2lf dq=%.2lf "
           " range:[%.1f, %.1f]\n",
           num_pass_left, stats.last_value, stats.value,
           stats.last_q, stats.q, stats.dq, stats.qmin, stats.qmax);
#endif
    if (enc->max_i4_header_bits_ > 0 && size_p0 > PARTITION0_SIZE_LIMIT) {
      ++num_pass_left;
      enc->max_i4_header_bits_ >>= 1;  // strengthen header bit limitation...
      if (is_last_pass) {
        ResetSideInfo(&it);
      }
      continue;                        // ...and start over
    }
    if (is_last_pass) {
      break;   // done
    }
    if (do_search) {
      ComputeNextQ(&stats);  // Adjust q
    }
  }
  if (ok) {
    if (!stats.do_size_search) {
      FinalizeTokenProbas(&enc->proba_);
    }
    ok = VP8EmitTokens(&enc->tokens_, enc->parts_ + 0,
                       (const uint8_t*)proba->coeffs_, 1);
  }
  ok = ok && WebPReportProgress(enc->pic_, enc->percent_ + 20, &enc->percent_);
  return PostLoopFinalize(&it, ok);
}